

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFormatParser.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  uint uVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CF64","");
  uVar1 = SoapySDR::formatToSize((string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  printf("%s -> %d bytes/element\t","CF64",uVar1 & 0xffffffff);
  if (uVar1 != 0x10) {
    printf("FAIL: expected %d bytes!\n",0x10);
  }
  else {
    puts("OK");
  }
  uVar2 = (uint)(uVar1 != 0x10);
  if (uVar2 == 0) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CF32","");
    uVar1 = SoapySDR::formatToSize((string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    printf("%s -> %d bytes/element\t","CF32",uVar1 & 0xffffffff);
    if (uVar1 == 8) {
      puts("OK");
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CS32","");
      uVar1 = SoapySDR::formatToSize((string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0]);
      }
      printf("%s -> %d bytes/element\t","CS32",uVar1 & 0xffffffff);
      if (uVar1 == 8) {
        puts("OK");
        local_38[0] = local_28;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CU32","");
        uVar1 = SoapySDR::formatToSize((string *)local_38);
        if (local_38[0] != local_28) {
          operator_delete(local_38[0]);
        }
        printf("%s -> %d bytes/element\t","CU32",uVar1 & 0xffffffff);
        if (uVar1 == 8) {
          puts("OK");
          local_38[0] = local_28;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CS16","");
          uVar1 = SoapySDR::formatToSize((string *)local_38);
          if (local_38[0] != local_28) {
            operator_delete(local_38[0]);
          }
          printf("%s -> %d bytes/element\t","CS16",uVar1 & 0xffffffff);
          if (uVar1 == 4) {
            puts("OK");
            local_38[0] = local_28;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CU16","");
            uVar1 = SoapySDR::formatToSize((string *)local_38);
            if (local_38[0] != local_28) {
              operator_delete(local_38[0]);
            }
            printf("%s -> %d bytes/element\t","CU16",uVar1 & 0xffffffff);
            if (uVar1 == 4) {
              puts("OK");
              local_38[0] = local_28;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CS12","");
              uVar1 = SoapySDR::formatToSize((string *)local_38);
              if (local_38[0] != local_28) {
                operator_delete(local_38[0]);
              }
              printf("%s -> %d bytes/element\t","CS12",uVar1 & 0xffffffff);
              if (uVar1 == 3) {
                puts("OK");
                local_38[0] = local_28;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CU12","");
                uVar1 = SoapySDR::formatToSize((string *)local_38);
                if (local_38[0] != local_28) {
                  operator_delete(local_38[0]);
                }
                printf("%s -> %d bytes/element\t","CU12",uVar1 & 0xffffffff);
                if (uVar1 == 3) {
                  puts("OK");
                  local_38[0] = local_28;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CS8","");
                  uVar1 = SoapySDR::formatToSize((string *)local_38);
                  if (local_38[0] != local_28) {
                    operator_delete(local_38[0]);
                  }
                  printf("%s -> %d bytes/element\t","CS8",uVar1 & 0xffffffff);
                  if (uVar1 == 2) {
                    puts("OK");
                    local_38[0] = local_28;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CU8","");
                    uVar1 = SoapySDR::formatToSize((string *)local_38);
                    if (local_38[0] != local_28) {
                      operator_delete(local_38[0]);
                    }
                    printf("%s -> %d bytes/element\t","CU8",uVar1 & 0xffffffff);
                    if (uVar1 == 2) {
                      puts("OK");
                      local_38[0] = local_28;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CS4","");
                      uVar1 = SoapySDR::formatToSize((string *)local_38);
                      if (local_38[0] != local_28) {
                        operator_delete(local_38[0]);
                      }
                      printf("%s -> %d bytes/element\t","CS4",uVar1 & 0xffffffff);
                      if (uVar1 == 1) {
                        puts("OK");
                        local_38[0] = local_28;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CU4","")
                        ;
                        uVar1 = SoapySDR::formatToSize((string *)local_38);
                        if (local_38[0] != local_28) {
                          operator_delete(local_38[0]);
                        }
                        printf("%s -> %d bytes/element\t","CU4",uVar1 & 0xffffffff);
                        if (uVar1 == 1) {
                          puts("OK");
                          local_38[0] = local_28;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_38,"F64","");
                          uVar1 = SoapySDR::formatToSize((string *)local_38);
                          if (local_38[0] != local_28) {
                            operator_delete(local_38[0]);
                          }
                          printf("%s -> %d bytes/element\t","F64",uVar1 & 0xffffffff);
                          if (uVar1 == 8) {
                            puts("OK");
                            local_38[0] = local_28;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_38,"F32","");
                            uVar1 = SoapySDR::formatToSize((string *)local_38);
                            if (local_38[0] != local_28) {
                              operator_delete(local_38[0]);
                            }
                            printf("%s -> %d bytes/element\t","F32",uVar1 & 0xffffffff);
                            if (uVar1 == 4) {
                              puts("OK");
                              local_38[0] = local_28;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_38,"S32","");
                              uVar1 = SoapySDR::formatToSize((string *)local_38);
                              if (local_38[0] != local_28) {
                                operator_delete(local_38[0]);
                              }
                              printf("%s -> %d bytes/element\t","S32",uVar1 & 0xffffffff);
                              if (uVar1 == 4) {
                                puts("OK");
                                local_38[0] = local_28;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_38,"U32","");
                                uVar1 = SoapySDR::formatToSize((string *)local_38);
                                if (local_38[0] != local_28) {
                                  operator_delete(local_38[0]);
                                }
                                printf("%s -> %d bytes/element\t","U32",uVar1 & 0xffffffff);
                                if (uVar1 == 4) {
                                  puts("OK");
                                  local_38[0] = local_28;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_38,"S16","");
                                  uVar1 = SoapySDR::formatToSize((string *)local_38);
                                  if (local_38[0] != local_28) {
                                    operator_delete(local_38[0]);
                                  }
                                  printf("%s -> %d bytes/element\t","S16",uVar1 & 0xffffffff);
                                  if (uVar1 == 2) {
                                    puts("OK");
                                    local_38[0] = local_28;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_38,"U16","");
                                    uVar1 = SoapySDR::formatToSize((string *)local_38);
                                    if (local_38[0] != local_28) {
                                      operator_delete(local_38[0]);
                                    }
                                    printf("%s -> %d bytes/element\t","U16",uVar1 & 0xffffffff);
                                    if (uVar1 == 2) {
                                      puts("OK");
                                      local_38[0] = local_28;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_38,"S8","");
                                      uVar1 = SoapySDR::formatToSize((string *)local_38);
                                      if (local_38[0] != local_28) {
                                        operator_delete(local_38[0]);
                                      }
                                      printf("%s -> %d bytes/element\t","S8",uVar1 & 0xffffffff);
                                      if (uVar1 == 1) {
                                        puts("OK");
                                        local_38[0] = local_28;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_38,"U8","");
                                        uVar1 = SoapySDR::formatToSize((string *)local_38);
                                        if (local_38[0] != local_28) {
                                          operator_delete(local_38[0]);
                                        }
                                        printf("%s -> %d bytes/element\t","U8",uVar1 & 0xffffffff);
                                        if (uVar1 == 1) {
                                          puts("OK");
                                          puts("DONE!");
                                          uVar2 = 0;
                                        }
                                        else {
                                          uVar2 = 1;
                                          printf("FAIL: expected %d bytes!\n",1);
                                        }
                                      }
                                      else {
                                        uVar2 = 1;
                                        printf("FAIL: expected %d bytes!\n",1);
                                      }
                                    }
                                    else {
                                      printf("FAIL: expected %d bytes!\n",2);
                                      uVar2 = 1;
                                    }
                                  }
                                  else {
                                    printf("FAIL: expected %d bytes!\n",2);
                                    uVar2 = 1;
                                  }
                                }
                                else {
                                  printf("FAIL: expected %d bytes!\n",4);
                                  uVar2 = 1;
                                }
                              }
                              else {
                                printf("FAIL: expected %d bytes!\n",4);
                                uVar2 = 1;
                              }
                            }
                            else {
                              printf("FAIL: expected %d bytes!\n",4);
                              uVar2 = 1;
                            }
                          }
                          else {
                            printf("FAIL: expected %d bytes!\n",8);
                            uVar2 = 1;
                          }
                        }
                        else {
                          uVar2 = 1;
                          printf("FAIL: expected %d bytes!\n",1);
                        }
                      }
                      else {
                        uVar2 = 1;
                        printf("FAIL: expected %d bytes!\n",1);
                      }
                    }
                    else {
                      printf("FAIL: expected %d bytes!\n",2);
                      uVar2 = 1;
                    }
                  }
                  else {
                    printf("FAIL: expected %d bytes!\n",2);
                    uVar2 = 1;
                  }
                }
                else {
                  printf("FAIL: expected %d bytes!\n",3);
                  uVar2 = 1;
                }
              }
              else {
                printf("FAIL: expected %d bytes!\n",3);
                uVar2 = 1;
              }
            }
            else {
              printf("FAIL: expected %d bytes!\n",4);
              uVar2 = 1;
            }
          }
          else {
            printf("FAIL: expected %d bytes!\n",4);
            uVar2 = 1;
          }
        }
        else {
          printf("FAIL: expected %d bytes!\n",8);
          uVar2 = 1;
        }
      }
      else {
        printf("FAIL: expected %d bytes!\n",8);
        uVar2 = 1;
      }
    }
    else {
      printf("FAIL: expected %d bytes!\n",8);
      uVar2 = 1;
    }
  }
  return uVar2;
}

Assistant:

int main(void)
{
    #define formatCheck(formatStr, expectedSize) \
    { \
        size_t bytes = SoapySDR::formatToSize(formatStr); \
        printf("%s -> %d bytes/element\t", formatStr, int(bytes)); \
        if (bytes != expectedSize) \
        { \
            printf("FAIL: expected %d bytes!\n", int(expectedSize)); \
            return EXIT_FAILURE; \
        } \
        else printf("OK\n"); \
    }

    formatCheck(SOAPY_SDR_CF64, 16);
    formatCheck(SOAPY_SDR_CF32, 8);
    formatCheck(SOAPY_SDR_CS32, 8);
    formatCheck(SOAPY_SDR_CU32, 8);
    formatCheck(SOAPY_SDR_CS16, 4);
    formatCheck(SOAPY_SDR_CU16, 4);
    formatCheck(SOAPY_SDR_CS12, 3);
    formatCheck(SOAPY_SDR_CU12, 3);
    formatCheck(SOAPY_SDR_CS8, 2);
    formatCheck(SOAPY_SDR_CU8, 2);
    formatCheck(SOAPY_SDR_CS4, 1);
    formatCheck(SOAPY_SDR_CU4, 1);

    formatCheck(SOAPY_SDR_F64, 8);
    formatCheck(SOAPY_SDR_F32, 4);
    formatCheck(SOAPY_SDR_S32, 4);
    formatCheck(SOAPY_SDR_U32, 4);
    formatCheck(SOAPY_SDR_S16, 2);
    formatCheck(SOAPY_SDR_U16, 2);
    formatCheck(SOAPY_SDR_S8, 1);
    formatCheck(SOAPY_SDR_U8, 1);

    printf("DONE!\n");
    return EXIT_SUCCESS;
}